

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

void __thiscall type::type(type *this)

{
  allocator local_31;
  string local_30 [32];
  type *local_10;
  type *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  this->numFields = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->fieldsName);
  this->dir = (directory *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,8,' ',&local_31);
  std::__cxx11::string::operator=((string *)this,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

type::type() {
    typeName = std::string(8, ' ');
}